

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppc_booke.c
# Opt level: O0

void store_booke_tsr_ppc(CPUPPCState_conflict *env,target_ulong val)

{
  ppc_tb_t *tb_env_00;
  uint64_t *next;
  uint8_t uVar1;
  ArchCPU_conflict17 *cpu_00;
  booke_timer_t *booke_timer;
  ppc_tb_t *tb_env;
  PowerPCCPU_conflict1 *cpu;
  CPUPPCState_conflict *env_local;
  
  cpu_00 = env_archcpu(env);
  tb_env_00 = env->tb_env;
  next = (uint64_t *)tb_env_00->opaque;
  env->spr[0x150] = ((uint)val ^ 0xffffffff) & env->spr[0x150];
  if ((val & 0x4000000) != 0) {
    uVar1 = booke_get_fit_target(env,tb_env_00);
    booke_update_fixed_timer(env,uVar1,next,(QEMUTimer *)next[1],0x4000000);
  }
  if ((val & 0x40000000) != 0) {
    uVar1 = booke_get_wdt_target(env,tb_env_00);
    booke_update_fixed_timer(env,uVar1,next + 2,(QEMUTimer *)next[3],0x40000000);
  }
  booke_update_irq(cpu_00);
  return;
}

Assistant:

void store_booke_tsr(CPUPPCState *env, target_ulong val)
{
    PowerPCCPU *cpu = env_archcpu(env);
    ppc_tb_t *tb_env = env->tb_env;
    booke_timer_t *booke_timer = tb_env->opaque;

    env->spr[SPR_BOOKE_TSR] &= ~val;
    // kvmppc_clear_tsr_bits(cpu, val);

    if (val & TSR_FIS) {
        booke_update_fixed_timer(env,
                                 booke_get_fit_target(env, tb_env),
                                 &booke_timer->fit_next,
                                 booke_timer->fit_timer,
                                 TSR_FIS);
    }

    if (val & TSR_WIS) {
        booke_update_fixed_timer(env,
                                 booke_get_wdt_target(env, tb_env),
                                 &booke_timer->wdt_next,
                                 booke_timer->wdt_timer,
                                 TSR_WIS);
    }

    booke_update_irq(cpu);
}